

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::nextSwitchSegment(Builder *this,Vector<Block_*> *segmentBlock,int nextSegment)

{
  Block *this_00;
  bool bVar1;
  reference ppBVar2;
  Function *this_01;
  Block *block;
  int lastSegment;
  int nextSegment_local;
  Vector<Block_*> *segmentBlock_local;
  Builder *this_local;
  
  if ((-1 < nextSegment + -1) && (bVar1 = Block::isTerminated(this->buildPoint), !bVar1)) {
    ppBVar2 = std::vector<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>::operator[]
                        (segmentBlock,(long)nextSegment);
    createBranch(this,*ppBVar2);
  }
  ppBVar2 = std::vector<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>::operator[]
                      (segmentBlock,(long)nextSegment);
  this_00 = *ppBVar2;
  this_01 = Block::getParent(this_00);
  Function::addBlock(this_01,this_00);
  setBuildPoint(this,this_00);
  return;
}

Assistant:

void Builder::nextSwitchSegment(dxil_spv::Vector<Block*>& segmentBlock, int nextSegment)
{
    int lastSegment = nextSegment - 1;
    if (lastSegment >= 0) {
        // Close out previous segment by jumping, if necessary, to next segment
        if (! buildPoint->isTerminated())
            createBranch(segmentBlock[nextSegment]);
    }
    Block* block = segmentBlock[nextSegment];
    block->getParent().addBlock(block);
    setBuildPoint(block);
}